

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PType::FillConversionPath(PType *this,Conversion **slots)

{
  while( true ) {
    if (this->Distance < 0) {
      return;
    }
    if (this->PredType == (PType *)0x0) break;
    slots[(ushort)this->Distance] = (this->PredType->Conversions).Array + this->PredConv;
    this = this->PredType;
  }
  __assert_fail("node->PredType != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0x149,"void PType::FillConversionPath(const PType::Conversion **)");
}

Assistant:

void PType::FillConversionPath(const PType::Conversion **slots)
{
	for (PType *node = this; node->Distance >= 0; node = node->PredType)
	{
		assert(node->PredType != NULL);
		slots[node->Distance] = &node->PredType->Conversions[node->PredConv];
	}
}